

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reg_alloc.cpp
# Opt level: O3

void __thiscall
backend::codegen::RegAllocator::replace_write(RegAllocator *this,ReplaceWriteAction r,int i)

{
  ConditionCode CVar1;
  int iVar2;
  pointer puVar3;
  Inst *pIVar4;
  ulong uVar5;
  bool bVar6;
  int iVar7;
  pointer __p;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  undefined8 *puVar9;
  ostream *poVar10;
  Tag *pTVar11;
  char *pcVar12;
  MemoryOperand *this_00;
  Reg RVar13;
  __hashtable *__h;
  size_type __dnew;
  anon_class_16_2_94732020 disp_reg;
  ostream local_139;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_138;
  undefined8 local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  char *local_118;
  Displayable local_110;
  char local_108;
  undefined4 uStack_107;
  undefined3 uStack_103;
  undefined5 uStack_100;
  undefined1 uStack_fb;
  undefined2 uStack_fa;
  ulong local_f8;
  _Head_base<0UL,_arm::LoadStoreInst_*,_false> local_f0;
  undefined1 *local_e8;
  undefined8 local_e0;
  undefined1 local_d8;
  undefined7 uStack_d7;
  undefined1 local_c8;
  undefined1 local_c0 [24];
  undefined5 local_a8;
  undefined3 uStack_a3;
  undefined1 uStack_a0;
  undefined7 uStack_9f;
  _Alloc_hider local_98;
  ulong local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  size_t local_78;
  bool local_70;
  anon_class_16_2_94732020 local_68;
  Tag *local_58;
  ReplaceWriteKind local_50;
  int local_4c;
  undefined **local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_50 = r.kind;
  pTVar11 = r._0_8_;
  local_68.r = (ReplaceWriteAction *)&local_58;
  local_68.i = &local_4c;
  RVar13 = r.replace_with;
  local_58 = pTVar11;
  local_4c = i;
  if (local_50 != Spill) {
    if (local_50 == Graph) {
      replace_write::anon_class_16_2_94732020::operator()(&local_68);
      local_139 = (ostream)0x0;
      AixLog::operator<<(&local_139,(Severity *)pTVar11);
      local_e8 = &local_d8;
      local_f0._M_head_impl = (LoadStoreInst *)&PTR__Tag_001eaf88;
      local_e0 = 0;
      local_d8 = 0;
      local_c8 = 1;
      AixLog::operator<<((ostream *)&local_f0,pTVar11);
      local_40._M_allocated_capacity = std::chrono::_V2::system_clock::now();
      local_48 = &PTR__Timestamp_001eaf58;
      local_40._M_local_buf[8] = '\0';
      AixLog::operator<<((ostream *)&local_48,(Timestamp *)pTVar11);
      local_108 = 'r';
      uStack_107 = 0x616c7065;
      uStack_103 = 0x5f6563;
      uStack_100 = 0x6574697277;
      local_110._vptr_Displayable = (_func_int **)0xd;
      uStack_fb = 0;
      local_f8 = 0x60;
      local_138 = &local_128;
      local_118 = &local_108;
      paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)std::__cxx11::string::_M_create((ulong *)&local_138,(ulong)&local_f8);
      uVar5 = local_f8;
      local_128._M_allocated_capacity = local_f8;
      pcVar12 = 
      "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
      ;
      local_138 = paVar8;
      memcpy(paVar8,
             "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
             ,0x60);
      paVar8->_M_local_buf[uVar5] = '\0';
      local_c0._0_4_ = 0x1eafb8;
      local_c0._4_4_ = 0;
      local_c0._8_8_ = local_118;
      if (local_118 == &local_108) {
        _uStack_a0 = CONCAT26(uStack_fa,CONCAT15(uStack_fb,uStack_100));
        local_c0._8_8_ = &local_a8;
      }
      local_a8._1_4_ = uStack_107;
      local_a8._0_1_ = local_108;
      uStack_a3 = uStack_103;
      local_98._M_p = (pointer)&local_88;
      local_c0._16_8_ = local_110._vptr_Displayable;
      local_110._vptr_Displayable = (_func_int **)0x0;
      local_108 = '\0';
      if (local_138 == &local_128) {
        local_88._8_8_ = local_128._8_8_;
      }
      else {
        local_98._M_p = (pointer)local_138;
      }
      local_88._M_allocated_capacity = local_128._M_allocated_capacity;
      local_90 = uVar5;
      local_130 = 0;
      local_128._M_allocated_capacity = local_128._M_allocated_capacity & 0xffffffffffffff00;
      local_78 = 0x2fd;
      local_70 = false;
      local_138 = &local_128;
      local_118 = &local_108;
      AixLog::operator<<((ostream *)local_c0,(Function *)pcVar12);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"graph",5);
      std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + -0x80);
      std::ostream::put(-0x80);
      std::ostream::flush();
    }
    else if (local_50 == Phys) {
      pTVar11 = (Tag *)local_c0;
      local_c0._8_4_ = 0xffffffff;
      local_c0._0_4_ = RVar13;
      local_c0._4_4_ = i;
      std::
      _Hashtable<unsigned_int,std::pair<unsigned_int_const,backend::codegen::Interval>,std::allocator<std::pair<unsigned_int_const,backend::codegen::Interval>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<std::pair<unsigned_int_const,backend::codegen::Interval>>
                ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,backend::codegen::Interval>,std::allocator<std::pair<unsigned_int_const,backend::codegen::Interval>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&this->active);
      replace_write::anon_class_16_2_94732020::operator()(&local_68);
      local_139 = (ostream)0x0;
      AixLog::operator<<(&local_139,(Severity *)pTVar11);
      local_e8 = &local_d8;
      local_f0._M_head_impl = (LoadStoreInst *)&PTR__Tag_001eaf88;
      local_e0 = 0;
      local_d8 = 0;
      local_c8 = 1;
      AixLog::operator<<((ostream *)&local_f0,pTVar11);
      local_40._M_allocated_capacity = std::chrono::_V2::system_clock::now();
      local_48 = &PTR__Timestamp_001eaf58;
      local_40._M_local_buf[8] = '\0';
      AixLog::operator<<((ostream *)&local_48,(Timestamp *)pTVar11);
      local_108 = 'r';
      uStack_107 = 0x616c7065;
      uStack_103 = 0x5f6563;
      uStack_100 = 0x6574697277;
      local_110._vptr_Displayable = (_func_int **)0xd;
      uStack_fb = 0;
      local_f8 = 0x60;
      local_138 = &local_128;
      local_118 = &local_108;
      paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)std::__cxx11::string::_M_create((ulong *)&local_138,(ulong)&local_f8);
      uVar5 = local_f8;
      local_128._M_allocated_capacity = local_f8;
      pcVar12 = 
      "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
      ;
      local_138 = paVar8;
      memcpy(paVar8,
             "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
             ,0x60);
      paVar8->_M_local_buf[uVar5] = '\0';
      local_c0._0_4_ = 0x1eafb8;
      local_c0._4_4_ = 0;
      local_c0._8_8_ = local_118;
      if (local_118 == &local_108) {
        _uStack_a0 = CONCAT26(uStack_fa,CONCAT15(uStack_fb,uStack_100));
        local_c0._8_8_ = &local_a8;
      }
      local_a8._1_4_ = uStack_107;
      local_a8._0_1_ = local_108;
      uStack_a3 = uStack_103;
      local_98._M_p = (pointer)&local_88;
      local_c0._16_8_ = local_110._vptr_Displayable;
      local_110._vptr_Displayable = (_func_int **)0x0;
      local_108 = '\0';
      if (local_138 == &local_128) {
        local_88._8_8_ = local_128._8_8_;
      }
      else {
        local_98._M_p = (pointer)local_138;
      }
      local_88._M_allocated_capacity = local_128._M_allocated_capacity;
      local_90 = uVar5;
      local_130 = 0;
      local_128._M_allocated_capacity = local_128._M_allocated_capacity & 0xffffffffffffff00;
      local_78 = 0x2f8;
      local_70 = false;
      local_138 = &local_128;
      local_118 = &local_108;
      AixLog::operator<<((ostream *)local_c0,(Function *)pcVar12);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"phys ",5);
      poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::clog);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
    }
    else {
      replace_write::anon_class_16_2_94732020::operator()(&local_68);
      local_139 = (ostream)0x0;
      AixLog::operator<<(&local_139,(Severity *)pTVar11);
      local_e8 = &local_d8;
      local_f0._M_head_impl = (LoadStoreInst *)&PTR__Tag_001eaf88;
      local_e0 = 0;
      local_d8 = 0;
      local_c8 = 1;
      AixLog::operator<<((ostream *)&local_f0,pTVar11);
      local_40._M_allocated_capacity = std::chrono::_V2::system_clock::now();
      local_48 = &PTR__Timestamp_001eaf58;
      local_40._M_local_buf[8] = '\0';
      AixLog::operator<<((ostream *)&local_48,(Timestamp *)pTVar11);
      local_108 = 'r';
      uStack_107 = 0x616c7065;
      uStack_103 = 0x5f6563;
      uStack_100 = 0x6574697277;
      local_110._vptr_Displayable = (_func_int **)0xd;
      uStack_fb = 0;
      local_f8 = 0x60;
      local_138 = &local_128;
      local_118 = &local_108;
      paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)std::__cxx11::string::_M_create((ulong *)&local_138,(ulong)&local_f8);
      uVar5 = local_f8;
      local_128._M_allocated_capacity = local_f8;
      pcVar12 = 
      "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
      ;
      local_138 = paVar8;
      memcpy(paVar8,
             "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
             ,0x60);
      paVar8->_M_local_buf[uVar5] = '\0';
      local_c0._0_4_ = 0x1eafb8;
      local_c0._4_4_ = 0;
      local_c0._8_8_ = local_118;
      if (local_118 == &local_108) {
        _uStack_a0 = CONCAT26(uStack_fa,CONCAT15(uStack_fb,uStack_100));
        local_c0._8_8_ = &local_a8;
      }
      local_a8._1_4_ = uStack_107;
      local_a8._0_1_ = local_108;
      uStack_a3 = uStack_103;
      local_98._M_p = (pointer)&local_88;
      local_c0._16_8_ = local_110._vptr_Displayable;
      local_110._vptr_Displayable = (_func_int **)0x0;
      local_108 = '\0';
      if (local_138 == &local_128) {
        local_88._8_8_ = local_128._8_8_;
      }
      else {
        local_98._M_p = (pointer)local_138;
      }
      local_88._M_allocated_capacity = local_128._M_allocated_capacity;
      local_90 = uVar5;
      local_130 = 0;
      local_128._M_allocated_capacity = local_128._M_allocated_capacity & 0xffffffffffffff00;
      local_78 = 0x319;
      local_70 = false;
      local_138 = &local_128;
      local_118 = &local_108;
      AixLog::operator<<((ostream *)local_c0,(Function *)pcVar12);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"temp",4);
      std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + -0x80);
      std::ostream::put(-0x80);
      std::ostream::flush();
    }
    AixLog::Function::~Function((Function *)local_c0);
    if (local_138 != &local_128) {
      operator_delete(local_138,local_128._M_allocated_capacity + 1);
    }
    if (local_118 != &local_108) {
      operator_delete(local_118,CONCAT35(uStack_103,CONCAT41(uStack_107,local_108)) + 1);
    }
    if (local_e8 == &local_d8) {
      return;
    }
    goto LAB_00178e78;
  }
  iVar7 = get_or_alloc_spill_pos(this,r.from);
  puVar3 = (this->inst_sink).
           super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((puVar3 == (this->inst_sink).
                 super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) ||
     (pIVar4 = puVar3[-1]._M_t.super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>.
               _M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
               super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl,
     (pIVar4->super_Displayable)._vptr_Displayable != (_func_int **)&PTR_display_001ed9b0)) {
LAB_0017886a:
    iVar2 = this->stack_offset;
    puVar9 = (undefined8 *)operator_new(0x50);
    CVar1 = this->cur_cond;
    *(undefined4 *)(puVar9 + 1) = 0x1c;
    *(ConditionCode *)((long)puVar9 + 0xc) = CVar1;
    *puVar9 = &PTR_display_001ed9b0;
    *(Reg *)(puVar9 + 2) = RVar13;
    puVar9[3] = &PTR_display_001ed7f0;
    puVar9[4] = 0xd00000000;
    *(undefined1 *)(puVar9 + 7) = 1;
    *(short *)(puVar9 + 5) = (short)iVar2 + (short)iVar7;
    *(undefined1 *)(puVar9 + 9) = 1;
    local_f0._M_head_impl = (LoadStoreInst *)0x0;
    local_c0._0_4_ = SUB84(puVar9,0);
    local_c0._4_4_ = (undefined4)((ulong)puVar9 >> 0x20);
    std::
    vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
    ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
              ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                *)&this->inst_sink,
               (unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)local_c0);
    if ((long *)CONCAT44(local_c0._4_4_,local_c0._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_c0._4_4_,local_c0._0_4_) + 0x10))();
    }
    local_c0._0_4_ = 0;
    local_c0._4_4_ = 0;
    std::unique_ptr<arm::LoadStoreInst,_std::default_delete<arm::LoadStoreInst>_>::~unique_ptr
              ((unique_ptr<arm::LoadStoreInst,_std::default_delete<arm::LoadStoreInst>_> *)&local_f0
              );
  }
  else {
    this_00 = (MemoryOperand *)0x0;
    if ((char)pIVar4[4].op == B) {
      this_00 = (MemoryOperand *)&pIVar4[1].op;
    }
    if (((pIVar4->op != StR) || (this_00->r1 != RVar13)) || (pIVar4->cond != this->cur_cond))
    goto LAB_0017886a;
    local_c0._0_4_ = 0x1ed7f0;
    local_c0._4_4_ = 0;
    local_c0._8_4_ = local_c0._8_4_ & 0xffffff00;
    local_c0._12_4_ = 0xd;
    local_c0._16_2_ = (short)this->stack_offset + (short)iVar7;
    uStack_a0 = 1;
    bVar6 = arm::MemoryOperand::operator==(this_00,(MemoryOperand *)local_c0);
    if (!bVar6) goto LAB_0017886a;
  }
  pTVar11 = (Tag *)&local_58;
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::_M_erase(&(this->wrote_to)._M_h);
  replace_write::anon_class_16_2_94732020::operator()(&local_68);
  local_139 = (ostream)0x0;
  AixLog::operator<<(&local_139,(Severity *)pTVar11);
  local_e8 = &local_d8;
  local_f0._M_head_impl = (LoadStoreInst *)&PTR__Tag_001eaf88;
  local_e0 = 0;
  local_d8 = 0;
  local_c8 = 1;
  AixLog::operator<<((ostream *)&local_f0,pTVar11);
  local_40._M_allocated_capacity = std::chrono::_V2::system_clock::now();
  local_48 = &PTR__Timestamp_001eaf58;
  local_40._M_local_buf[8] = '\0';
  AixLog::operator<<((ostream *)&local_48,(Timestamp *)pTVar11);
  local_108 = 'r';
  uStack_107 = 0x616c7065;
  uStack_103 = 0x5f6563;
  uStack_100 = 0x6574697277;
  local_110._vptr_Displayable = (_func_int **)0xd;
  uStack_fb = 0;
  local_f8 = 0x60;
  local_138 = &local_128;
  local_118 = &local_108;
  paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)std::__cxx11::string::_M_create((ulong *)&local_138,(ulong)&local_f8);
  uVar5 = local_f8;
  local_128._M_allocated_capacity = local_f8;
  pcVar12 = 
  "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
  ;
  local_138 = paVar8;
  memcpy(paVar8,
         "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
         ,0x60);
  paVar8->_M_local_buf[uVar5] = '\0';
  local_c0._0_4_ = 0x1eafb8;
  local_c0._4_4_ = 0;
  local_c0._8_8_ = local_118;
  if (local_118 == &local_108) {
    _uStack_a0 = CONCAT26(uStack_fa,CONCAT15(uStack_fb,uStack_100));
    local_c0._8_8_ = &local_a8;
  }
  local_a8._1_4_ = uStack_107;
  local_a8._0_1_ = local_108;
  uStack_a3 = uStack_103;
  local_98._M_p = (pointer)&local_88;
  local_c0._16_8_ = local_110._vptr_Displayable;
  local_110._vptr_Displayable = (_func_int **)0x0;
  local_108 = '\0';
  if (local_138 == &local_128) {
    local_88._8_8_ = local_128._8_8_;
  }
  else {
    local_98._M_p = (pointer)local_138;
  }
  local_88._M_allocated_capacity = local_128._M_allocated_capacity;
  local_90 = uVar5;
  local_130 = 0;
  local_128._M_allocated_capacity = local_128._M_allocated_capacity & 0xffffffffffffff00;
  local_78 = 0x316;
  local_70 = false;
  local_138 = &local_128;
  local_118 = &local_108;
  AixLog::operator<<((ostream *)local_c0,(Function *)pcVar12);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"spill ",6);
  poVar10 = (ostream *)std::ostream::operator<<(&std::clog,iVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
  poVar10 = std::ostream::_M_insert<bool>(SUB81(poVar10,0));
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  AixLog::Function::~Function((Function *)local_c0);
  if (local_138 != &local_128) {
    operator_delete(local_138,local_128._M_allocated_capacity + 1);
  }
  if (local_118 != &local_108) {
    operator_delete(local_118,CONCAT35(uStack_103,CONCAT41(uStack_107,local_108)) + 1);
  }
  if (local_e8 == &local_d8) {
    return;
  }
LAB_00178e78:
  local_f0._M_head_impl = (LoadStoreInst *)&PTR__Tag_001eaf88;
  operator_delete(local_e8,CONCAT71(uStack_d7,local_d8) + 1);
  return;
}

Assistant:

void RegAllocator::replace_write(ReplaceWriteAction r, int i) {
  auto disp_reg = [&]() {
    display_reg_name(LOG(TRACE), r.from);
    LOG(TRACE) << " at: " << i << " ";
  };
  if (r.kind == ReplaceWriteKind::Phys) {
    // is physical register; mark as occupied
    active.insert({r.replace_with, Interval(i, UINT32_MAX)});
    disp_reg();
    LOG(TRACE) << "phys " << r.replace_with << std::endl;
    return;
  } else if (r.kind == ReplaceWriteKind::Graph) {
    // This register is allocated with graph-coloring
    disp_reg();
    LOG(TRACE) << "graph" << std::endl;
  } else if (r.kind == ReplaceWriteKind::Spill) {
    // this register is allocated in stack
    Reg rd = r.replace_with;
    int pos = get_or_alloc_spill_pos(r.from);

    bool del = false;
    if (inst_sink.size() > 0) {
      auto &x = inst_sink.back();
      if (auto x_ = dynamic_cast<LoadStoreInst *>(&*x)) {
        if (auto x__ = std::get_if<MemoryOperand>(&x_->mem);
            x_->op == arm::OpCode::StR && x__->r1 == rd &&
            x_->cond == cur_cond &&
            (*x__) == MemoryOperand(REG_SP, pos + stack_offset)) {
          del = true;
        }
      }
    }
    if (!del) {
      inst_sink.push_back(std::make_unique<LoadStoreInst>(
          OpCode::StR, rd, MemoryOperand(REG_SP, pos + stack_offset),
          cur_cond));
    }
    wrote_to.erase(r.from);
    disp_reg();
    LOG(TRACE) << "spill " << pos << " " << del << std::endl;
  } else {
    disp_reg();
    LOG(TRACE) << "temp" << std::endl;
    // Is temporary register
    // the register should already be written to or read from

    // throw new std::logic_error("Writing to transient register");
  }
}